

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O3

void __thiscall DIS::IncomingMessage::IncomingMessage(IncomingMessage *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_IBufferProcessor)._vptr_IBufferProcessor =
       (_func_int **)&PTR__IncomingMessage_0019ee88;
  p_Var1 = &(this->_processors)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->_processors)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_processors)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_processors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_processors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_processors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->_pduBanks)._M_t._M_impl.super__Rb_tree_header;
  (this->_processors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->_pduBanks)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_pduBanks)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_pduBanks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_pduBanks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_pduBanks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_pduBanks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

IncomingMessage::IncomingMessage()
: _processors(), _pduBanks()
{
}